

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xpath_allocator::allocate(xpath_allocator *this,size_t size)

{
  ulong uVar1;
  long in_RSI;
  long *in_RDI;
  xpath_memory_block *block;
  size_t block_size;
  size_t block_capacity;
  size_t block_capacity_req;
  size_t block_capacity_base;
  void *buf;
  ulong local_58;
  long *local_8;
  
  uVar1 = in_RSI + 7U & 0xfffffffffffffff8;
  if (*(ulong *)(*in_RDI + 8) < in_RDI[1] + uVar1) {
    local_58 = uVar1 + 0x400;
    if (local_58 < 0x1000) {
      local_58 = 0x1000;
    }
    local_8 = (long *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)(local_58 + 0x10);
    if (local_8 == (long *)0x0) {
      if (in_RDI[2] != 0) {
        *(undefined1 *)in_RDI[2] = 1;
      }
      local_8 = (long *)0x0;
    }
    else {
      *local_8 = *in_RDI;
      local_8[1] = local_58;
      *in_RDI = (long)local_8;
      in_RDI[1] = uVar1;
      local_8 = local_8 + 2;
    }
  }
  else {
    local_8 = (long *)(*in_RDI + 0x10 + in_RDI[1]);
    in_RDI[1] = uVar1 + in_RDI[1];
  }
  return local_8;
}

Assistant:

void* allocate(size_t size)
		{
			// round size up to block alignment boundary
			size = (size + xpath_memory_block_alignment - 1) & ~(xpath_memory_block_alignment - 1);

			if (_root_size + size <= _root->capacity)
			{
				void* buf = &_root->data[0] + _root_size;
				_root_size += size;
				return buf;
			}
			else
			{
				// make sure we have at least 1/4th of the page free after allocation to satisfy subsequent allocation requests
				size_t block_capacity_base = sizeof(_root->data);
				size_t block_capacity_req = size + block_capacity_base / 4;
				size_t block_capacity = (block_capacity_base > block_capacity_req) ? block_capacity_base : block_capacity_req;

				size_t block_size = block_capacity + offsetof(xpath_memory_block, data);

				xpath_memory_block* block = static_cast<xpath_memory_block*>(xml_memory::allocate(block_size));
				if (!block)
				{
					if (_error) *_error = true;
					return NULL;
				}

				block->next = _root;
				block->capacity = block_capacity;

				_root = block;
				_root_size = size;

				return block->data;
			}
		}